

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

void Vec_WrdSort(Vec_Wrd_t *p,int fReverse)

{
  int fReverse_local;
  Vec_Wrd_t *p_local;
  
  if (fReverse == 0) {
    qsort(p->pArray,(long)p->nSize,8,Vec_WrdSortCompare1);
  }
  else {
    qsort(p->pArray,(long)p->nSize,8,Vec_WrdSortCompare2);
  }
  return;
}

Assistant:

static inline void Vec_WrdSort( Vec_Wrd_t * p, int fReverse )
{
    if ( fReverse ) 
        qsort( (void *)p->pArray, p->nSize, sizeof(word), 
                (int (*)(const void *, const void *)) Vec_WrdSortCompare2 );
    else
        qsort( (void *)p->pArray, p->nSize, sizeof(word), 
                (int (*)(const void *, const void *)) Vec_WrdSortCompare1 );
}